

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCFifoUnix.cpp
# Opt level: O2

bool __thiscall gnilk::IPCFifoUnix::Available(IPCFifoUnix *this)

{
  int iVar1;
  pollfd pfd;
  
  pfd.events = 1;
  pfd.revents = 0;
  pfd.fd = this->rwfd;
  iVar1 = poll((pollfd *)&pfd,1,0);
  return iVar1 == 1;
}

Assistant:

bool IPCFifoUnix::Available() {
    struct pollfd pfd {
            .fd = rwfd,
            .events = POLLIN,
            .revents = {},
    };

    // Non-blocking poll...
    if (poll(&pfd, 1, 0)==1) {
        return true;
    }
    return false;
}